

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selfguided_sse4.c
# Opt level: O0

__m256i * cross_sum_fast_even_row(int32_t *buf,int stride)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  int in_ESI;
  int iVar7;
  undefined4 in_register_00000034;
  long in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 in_XMM0_Qb;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 in_YMM0_H;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 in_register_00001218;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  __m256i fives_plus_sixes;
  __m256i sixes;
  __m256i fives;
  __m256i xbr;
  __m256i xb;
  __m256i xbl;
  __m256i xtr;
  __m256i xt;
  __m256i xtl;
  
  iVar7 = in_ESI;
  yy_loadu_256((__m256i *)(in_RDI + -4 + (long)in_ESI * -4),
               (void *)CONCAT44(in_register_00000034,in_ESI));
  uVar8 = in_XMM0_Qa;
  uVar13 = in_XMM0_Qb;
  uVar18 = in_YMM0_H;
  uVar23 = in_register_00001218;
  yy_loadu_256((__m256i *)(in_RDI + (long)in_ESI * -4),(void *)CONCAT44(in_register_00000034,iVar7))
  ;
  uVar9 = uVar8;
  uVar14 = uVar13;
  uVar19 = uVar18;
  uVar24 = uVar23;
  yy_loadu_256((__m256i *)(in_RDI + 4 + (long)in_ESI * -4),
               (void *)CONCAT44(in_register_00000034,iVar7));
  uVar10 = uVar9;
  uVar15 = uVar14;
  uVar20 = uVar19;
  uVar25 = uVar24;
  yy_loadu_256((__m256i *)(in_RDI + -4 + (long)in_ESI * 4),
               (void *)CONCAT44(in_register_00000034,iVar7));
  uVar11 = uVar10;
  uVar16 = uVar15;
  uVar21 = uVar20;
  uVar26 = uVar25;
  yy_loadu_256((__m256i *)(in_RDI + (long)in_ESI * 4),(void *)CONCAT44(in_register_00000034,iVar7));
  uVar12 = uVar11;
  uVar17 = uVar16;
  uVar22 = uVar21;
  uVar27 = uVar26;
  yy_loadu_256((__m256i *)(in_RDI + 4 + (long)in_ESI * 4),
               (void *)CONCAT44(in_register_00000034,iVar7));
  auVar6._8_8_ = uVar17;
  auVar6._0_8_ = uVar12;
  auVar6._16_8_ = uVar22;
  auVar6._24_8_ = uVar27;
  auVar1._8_8_ = uVar15;
  auVar1._0_8_ = uVar10;
  auVar1._16_8_ = uVar20;
  auVar1._24_8_ = uVar25;
  auVar1 = vpaddd_avx2(auVar6,auVar1);
  auVar5._8_8_ = uVar14;
  auVar5._0_8_ = uVar9;
  auVar5._16_8_ = uVar19;
  auVar5._24_8_ = uVar24;
  auVar1 = vpaddd_avx2(auVar5,auVar1);
  auVar4._8_8_ = in_XMM0_Qb;
  auVar4._0_8_ = in_XMM0_Qa;
  auVar4._16_8_ = in_YMM0_H;
  auVar4._24_8_ = in_register_00001218;
  auVar1 = vpaddd_avx2(auVar4,auVar1);
  auVar3._8_8_ = uVar13;
  auVar3._0_8_ = uVar8;
  auVar3._16_8_ = uVar18;
  auVar3._24_8_ = uVar23;
  auVar2._8_8_ = uVar16;
  auVar2._0_8_ = uVar11;
  auVar2._16_8_ = uVar21;
  auVar2._24_8_ = uVar26;
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  auVar3 = vpslld_avx2(auVar1,ZEXT416(2));
  auVar1 = vpaddd_avx2(auVar3,auVar1);
  vpaddd_avx2(auVar1,auVar2);
  return (__m256i *)0x2;
}

Assistant:

static inline __m128i cross_sum_fast_even_row(const int32_t *buf, int stride) {
  const __m128i xtl = xx_loadu_128(buf - 1 - stride);
  const __m128i xt = xx_loadu_128(buf - stride);
  const __m128i xtr = xx_loadu_128(buf + 1 - stride);
  const __m128i xbl = xx_loadu_128(buf - 1 + stride);
  const __m128i xb = xx_loadu_128(buf + stride);
  const __m128i xbr = xx_loadu_128(buf + 1 + stride);

  const __m128i fives =
      _mm_add_epi32(xtl, _mm_add_epi32(xtr, _mm_add_epi32(xbr, xbl)));
  const __m128i sixes = _mm_add_epi32(xt, xb);
  const __m128i fives_plus_sixes = _mm_add_epi32(fives, sixes);

  return _mm_add_epi32(
      _mm_add_epi32(_mm_slli_epi32(fives_plus_sixes, 2), fives_plus_sixes),
      sixes);
}